

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O1

void __thiscall amrex::Geometry::refine(Geometry *this,IntVect *rr)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  
  if (((rr->vect[0] != 1) || (rr->vect[1] != 1)) || (rr->vect[2] != 1)) {
    uVar1 = (this->domain).btype.itype;
    (this->domain).smallend.vect[0] = rr->vect[0] * (this->domain).smallend.vect[0];
    iVar2 = (this->domain).smallend.vect[2];
    (this->domain).smallend.vect[1] = (this->domain).smallend.vect[1] * rr->vect[1];
    (this->domain).smallend.vect[2] = iVar2 * rr->vect[2];
    iVar6 = (this->domain).bigend.vect[0] + (~uVar1 & 1);
    (this->domain).bigend.vect[0] = iVar6;
    uVar4 = (uint)((uVar1 & 2) == 0);
    iVar7 = (this->domain).bigend.vect[1] + uVar4;
    (this->domain).bigend.vect[1] = iVar7;
    uVar5 = (uint)((uVar1 & 4) == 0);
    iVar8 = (this->domain).bigend.vect[2] + uVar5;
    (this->domain).bigend.vect[2] = iVar8;
    iVar6 = iVar6 * rr->vect[0];
    (this->domain).bigend.vect[0] = iVar6;
    iVar7 = iVar7 * rr->vect[1];
    (this->domain).bigend.vect[1] = iVar7;
    iVar2 = rr->vect[2];
    (this->domain).bigend.vect[0] = iVar6 - (~uVar1 & 1);
    (this->domain).bigend.vect[1] = iVar7 - uVar4;
    (this->domain).bigend.vect[2] = iVar8 * iVar2 - uVar5;
  }
  lVar3 = -6;
  do {
    dVar9 = (*(double *)((long)(this->roundoff_hi_d).arr + lVar3 * 4) -
            *(double *)((long)(this->prob_domain).xhi + lVar3 * 4)) /
            (double)((*(int *)((long)&((IndexType *)(&(this->domain).bigend + 1))->itype + lVar3 * 2
                              ) - *(int *)((long)(this->domain).bigend.vect + lVar3 * 2)) + 1);
    *(double *)((long)(this->super_CoordSys).inv_dx + lVar3 * 4) = dVar9;
    *(double *)((long)(this->prob_domain).xlo + lVar3 * 4 + -8) = 1.0 / dVar9;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0);
  return;
}

Assistant:

bool operator!= (int val) const noexcept
    {
        return AMREX_D_TERM(vect[0] != val, || vect[1] != val, || vect[2] != val);
    }